

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewOrderSingle.h
# Opt level: O0

void __thiscall
FIX44::NewOrderSingle::NewOrderSingle
          (NewOrderSingle *this,ClOrdID *aClOrdID,Side *aSide,TransactTime *aTransactTime,
          OrdType *aOrdType)

{
  MsgType local_88;
  OrdType *local_30;
  OrdType *aOrdType_local;
  TransactTime *aTransactTime_local;
  Side *aSide_local;
  ClOrdID *aClOrdID_local;
  NewOrderSingle *this_local;
  
  local_30 = aOrdType;
  aOrdType_local = (OrdType *)aTransactTime;
  aTransactTime_local = (TransactTime *)aSide;
  aSide_local = (Side *)aClOrdID;
  aClOrdID_local = (ClOrdID *)this;
  MsgType();
  FIX44::Message::Message(&this->super_Message,&local_88);
  FIX::MsgType::~MsgType(&local_88);
  *(undefined ***)&this->super_Message = &PTR__NewOrderSingle_0018a118;
  set(this,(ClOrdID *)aSide_local);
  set(this,(Side *)aTransactTime_local);
  set(this,(TransactTime *)aOrdType_local);
  set(this,local_30);
  return;
}

Assistant:

NewOrderSingle(
      const FIX::ClOrdID& aClOrdID,
      const FIX::Side& aSide,
      const FIX::TransactTime& aTransactTime,
      const FIX::OrdType& aOrdType )
    : Message(MsgType())
    {
      set(aClOrdID);
      set(aSide);
      set(aTransactTime);
      set(aOrdType);
    }